

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

Lexer * __thiscall Lexer::operator=(Lexer *this,Lexer *lexer)

{
  int iVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->input_);
  this->index_ = lexer->index_;
  this->current_ = lexer->current_;
  iVar1 = (lexer->position_).super_Position.col_;
  (this->position_).super_Position.row_ = (lexer->position_).super_Position.row_;
  (this->position_).super_Position.col_ = iVar1;
  this->in_row_comment_ = lexer->in_row_comment_;
  this->in_block_comment_ = lexer->in_block_comment_;
  return this;
}

Assistant:

Lexer &Lexer::operator = (const Lexer &lexer) {
    input_ = lexer.input_;
    index_ = lexer.index_;
    current_ = lexer.current_;
    position_ = lexer.position_;
    in_row_comment_ = lexer.in_row_comment_;
    in_block_comment_ = lexer.in_block_comment_;
    return *this;
}